

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O2

self * __thiscall
boost::python::
class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
::
add_property<std::vector<int,std::allocator<int>>HFParsingInfo::*,std::vector<int,std::allocator<int>>HFParsingInfo::*>
          (class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
           *this,char *name,offset_in_HFParsingInfo_to_vector<int,_std::allocator<int>_> fget,
          offset_in_HFParsingInfo_to_vector<int,_std::allocator<int>_> fset,char *docstr)

{
  object_base local_30;
  object_base local_28;
  
  make_getter<std::vector<int,std::allocator<int>>HFParsingInfo::*>
            ((class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_28,(offset_in_HFParsingInfo_to_vector<int,_std::allocator<int>_>)this);
  make_setter<std::vector<int,std::allocator<int>>HFParsingInfo::*>
            ((class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_30,(offset_in_HFParsingInfo_to_vector<int,_std::allocator<int>_>)this);
  objects::class_base::add_property
            ((class_base *)this,name,(object *)&local_28,(object *)&local_30,docstr);
  api::object_base::~object_base(&local_30);
  api::object_base::~object_base(&local_28);
  return (self *)this;
}

Assistant:

self& add_property(char const* name, Get fget, Set fset, char const* docstr = 0)
    {
        base::add_property(
            name, this->make_getter(fget), this->make_setter(fset), docstr);
        return *this;
    }